

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

void __thiscall
wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::TestBody
          (SuffixTreeTest_TestSingleCharacterRepeat_Test *this)

{
  uint __n;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  RepeatedSubstring *__x;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  reference puVar5;
  char *in_R9;
  iterator_range<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  iVar6;
  string local_390;
  AssertHelper local_370;
  Message local_368 [2];
  uint *local_358;
  uint *local_350;
  iterator_range<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_348;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_;
  iterator iStack_310;
  uint StartIdx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Message local_2f0;
  unsigned_long local_2e8;
  size_type local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_1;
  RepeatedSubstring *RS;
  iterator __end1;
  iterator __begin1;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *__range1;
  Message local_2a0;
  uint local_294;
  size_type local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar;
  iterator local_230;
  undefined1 local_1e8 [8];
  iterator It;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  SuffixTree ST;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  iterator RRDIt2;
  iterator RRDIt;
  allocator<unsigned_int> local_59;
  uint local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedRepetitionData;
  SuffixTreeTest_TestSingleCharacterRepeat_Test *this_local;
  
  local_58[4] = 1;
  local_58[5] = 1;
  local_58[6] = 2;
  local_58[0] = 1;
  local_58[1] = 1;
  local_58[2] = 1;
  local_58[3] = 1;
  local_38 = local_58;
  local_30 = 7;
  RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_int>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,__l,&local_59);
  std::allocator<unsigned_int>::~allocator(&local_59);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  __normal_iterator(&RRDIt2);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  __normal_iterator(&local_80);
  ::wasm::SuffixTree::SuffixTree
            ((SuffixTree *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(vector *)local_28);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
            *)&It.MinLength);
  SuffixTree::begin((iterator *)local_1e8,
                    (SuffixTree *)
                    &SubStrings.
                     super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    SuffixTree::end(&local_230,
                    (SuffixTree *)
                    &SubStrings.
                     super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = SuffixTree::RepeatedSubstringIterator::operator!=
                      ((RepeatedSubstringIterator *)local_1e8,&local_230);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator(&local_230);
    if (!bVar1) break;
    __x = SuffixTree::RepeatedSubstringIterator::operator*((RepeatedSubstringIterator *)local_1e8);
    std::
    vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
    ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 *)&It.MinLength,__x);
    SuffixTree::RepeatedSubstringIterator::operator++
              ((RepeatedSubstringIterator *)&gtest_ar.message_,
               (RepeatedSubstringIterator *)local_1e8,0);
    SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
              ((RepeatedSubstringIterator *)&gtest_ar.message_);
  }
  SuffixTree::RepeatedSubstringIterator::~RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)local_1e8);
  local_290 = std::
              vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ::size((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                      *)&It.MinLength);
  local_294 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_288,"SubStrings.size()","1u",&local_290,&local_294);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  __end1 = std::
           vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           ::begin((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                    *)&It.MinLength);
  RS = (RepeatedSubstring *)
       std::
       vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
       ::end((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              *)&It.MinLength);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
                                *)&RS);
    if (!bVar1) break;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
           ::operator*(&__end1);
    local_2e0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ((long)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8));
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
    local_2e8 = sVar3 - *(uint *)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_2d8,"RS.StartIndices.size()",
               "RepeatedRepetitionData.size() - RS.Length",&local_2e0,&local_2e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x62,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range2,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range2);
      testing::Message::~Message(&local_2f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
    pvVar4 = std::
             vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             ::operator[]((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                           *)&It.MinLength,0);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pvVar4->StartIndices);
    iStack_310 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&pvVar4->StartIndices);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffcf0);
      if (!bVar1) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      __n = *puVar5;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
      local_80._M_current =
           (uint *)gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      RRDIt2._M_current =
           (uint *)gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      std::
      advance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                (&RRDIt2,__n);
      pvVar4 = std::
               vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               ::operator[]((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                             *)&It.MinLength,0);
      std::
      advance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                (&local_80,__n + pvVar4->Length);
      local_350 = RRDIt2._M_current;
      local_358 = local_80._M_current;
      iVar6 = llvm::
              make_range<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )RRDIt2._M_current,local_80);
      local_348 = iVar6;
      local_331 = llvm::
                  all_of<llvm::iterator_range<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::TestBody()::__0>
                            (&local_348);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_330,&local_331,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
      if (!bVar1) {
        testing::Message::Message(local_368);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_390,(internal *)local_330,
                   (AssertionResult *)
                   "all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2), [](unsigned Elt) { return Elt == 1; })"
                   ,"false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_370,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x69,pcVar2);
        testing::internal::AssertHelper::operator=(&local_370,local_368);
        testing::internal::AssertHelper::~AssertHelper(&local_370);
        std::__cxx11::string::~string((string *)&local_390);
        testing::Message::~Message(local_368);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
      if (!bVar1) goto LAB_0037b3ff;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
    ::operator++(&__end1);
  }
LAB_0037b3ff:
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&It.MinLength);
  SuffixTree::~SuffixTree
            ((SuffixTree *)
             &SubStrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleCharacterRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 1, 1, 1, 1, 2};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    EXPECT_EQ(RS.StartIndices.size(),
              RepeatedRepetitionData.size() - RS.Length);
    for (unsigned StartIdx : SubStrings[0].StartIndices) {
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + SubStrings[0].Length);
      ASSERT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}